

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_fma::create_pipeline_int8_x86(InnerProduct_x86_fma *this,Option *opt)

{
  Mat *this_00;
  float fVar1;
  uint _h;
  float *pfVar2;
  void *pvVar3;
  int *piVar4;
  Allocator *pAVar5;
  ulong uVar6;
  int _w;
  long lVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  int j;
  size_t sVar11;
  int _elempack;
  size_t _elemsize;
  byte bVar12;
  float fVar13;
  Mat weight_data_r2;
  Mat local_78;
  
  _h = (this->super_InnerProduct).num_output;
  uVar6 = (long)(this->super_InnerProduct).weight_data_size / (long)(int)_h;
  bVar12 = (_h & 7) == 0 & opt->use_packing_layout;
  _elemsize = 1;
  if (bVar12 != 0) {
    _elemsize = 8;
  }
  this_00 = &(this->super_InnerProduct).weight_data;
  _w = (int)uVar6;
  Mat::reshape(&local_78,this_00,_w,_h,(Allocator *)0x0);
  _elempack = (int)_elemsize;
  Mat::create(&this->weight_data_tm,_w,(this->super_InnerProduct).num_output / _elempack,_elemsize,
              _elempack,(Allocator *)0x0);
  if (_elempack <= (this->super_InnerProduct).num_output) {
    lVar7 = 0;
    do {
      if (0 < _w) {
        pvVar8 = (void *)((ulong)((uint)lVar7 >> bVar12 * '\x03') * (long)(this->weight_data_tm).w *
                          (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        uVar10 = 0;
        do {
          sVar11 = 0;
          do {
            *(undefined1 *)((long)pvVar8 + sVar11) =
                 *(undefined1 *)
                  ((long)local_78.data +
                  uVar10 + (long)local_78.w * (lVar7 + sVar11) * local_78.elemsize);
            sVar11 = sVar11 + 1;
          } while (_elemsize != sVar11);
          uVar10 = uVar10 + 1;
          pvVar8 = (void *)((long)pvVar8 + sVar11);
        } while (uVar10 != (uVar6 & 0xffffffff));
      }
      lVar7 = lVar7 + _elemsize;
    } while ((long)(lVar7 + (ulong)(_elempack - 1)) < (long)(this->super_InnerProduct).num_output);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  Mat::create(&this->scale_in_data,(this->super_InnerProduct).num_output,4,(Allocator *)0x0);
  lVar7 = (long)(this->super_InnerProduct).num_output;
  if (0 < lVar7) {
    pvVar8 = (this->super_InnerProduct).weight_data_int8_scales.data;
    pfVar2 = (float *)(this->super_InnerProduct).bottom_blob_int8_scales.data;
    pvVar3 = (this->scale_in_data).data;
    lVar9 = 0;
    do {
      fVar1 = *(float *)((long)pvVar8 + lVar9 * 4);
      fVar13 = 0.0;
      if (fVar1 != 0.0) {
        fVar13 = 1.0 / (fVar1 * *pfVar2);
      }
      *(float *)((long)pvVar3 + lVar9 * 4) = fVar13;
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  if (opt->lightmode != false) {
    piVar4 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar8 = (this->super_InnerProduct).weight_data.data;
        pAVar5 = (this->super_InnerProduct).weight_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar8 != (void *)0x0) {
            free(pvVar8);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_InnerProduct).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.elemsize + 4) = 0;
    this_00->data = (void *)0x0;
    (this->super_InnerProduct).weight_data.refcount = (int *)0x0;
    (this->super_InnerProduct).weight_data.dims = 0;
    (this->super_InnerProduct).weight_data.w = 0;
    (this->super_InnerProduct).weight_data.h = 0;
    (this->super_InnerProduct).weight_data.d = 0;
    (this->super_InnerProduct).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_fma::create_pipeline_int8_x86(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__

    // src = inch-outch
    // dst = pb-inch-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        weight_data_tm.create(num_input, num_output / out_elempack, (size_t)out_elempack, out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            signed char* g0 = weight_data_tm.row<signed char>(q / out_elempack);

            for (int p = 0; p < num_input; p++)
            {
                for (int j = 0; j < out_elempack; j++)
                {
                    *g0++ = weight_data_r2.row<signed char>(q + j)[p];
                }
            }
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // dequantize
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}